

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

int pm_to_cham(int mndx)

{
  int iVar1;
  
  if (mndx == 0x155) {
    iVar1 = 1;
  }
  else if (mndx == 0x148) {
    iVar1 = 3;
  }
  else {
    if (mndx != 0x117) {
      return 0;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int pm_to_cham(int mndx)
{
	int mcham;

	switch (mndx) {
	case PM_CHAMELEON:	mcham = CHAM_CHAMELEON; break;
	case PM_DOPPELGANGER:	mcham = CHAM_DOPPELGANGER; break;
	case PM_SANDESTIN:	mcham = CHAM_SANDESTIN; break;
	default: mcham = CHAM_ORDINARY; break;
	}
	return mcham;
}